

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O1

void __thiscall
tchecker::syncprod::transition_t::transition_t
          (transition_t *this,transition_t *t,sync_id_t sync_id,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
          *vedge)

{
  vedge_sptr_t *this_00;
  bool bVar1;
  
  this->_sync_id = sync_id;
  this_00 = &this->_vedge;
  (this->_vedge)._t = (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::reset
            (this_00,vedge->_t);
  if (this->_sync_id == 0xffffffff) {
    if (&this_00->_t->super_vedge_t == (vedge_t *)0x0) {
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1d0,
                    "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vedge_t>]"
                   );
    }
    bVar1 = is_asynchronous(&this_00->_t->super_vedge_t);
    if (!bVar1) {
      __assert_fail("(_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/transition.cc"
                    ,0x24,
                    "tchecker::syncprod::transition_t::transition_t(const tchecker::syncprod::transition_t &, tchecker::sync_id_t, const tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> &)"
                   );
    }
  }
  if (this_00->_t != (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) {
    return;
  }
  __assert_fail("_vedge.ptr() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/transition.cc"
                ,0x25,
                "tchecker::syncprod::transition_t::transition_t(const tchecker::syncprod::transition_t &, tchecker::sync_id_t, const tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> &)"
               );
}

Assistant:

transition_t::transition_t(tchecker::syncprod::transition_t const & t, tchecker::sync_id_t sync_id,
                           tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> const & vedge)
    : tchecker::ts::transition_t(t), _sync_id(sync_id), _vedge(vedge)
{
  assert((_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge));
  assert(_vedge.ptr() != nullptr);
}